

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnI64ConstExpr
          (BinaryReaderInterp *this,uint64_t value)

{
  bool bVar1;
  Type local_50;
  Location local_48;
  Enum local_24;
  uint64_t local_20;
  uint64_t value_local;
  BinaryReaderInterp *this_local;
  
  local_20 = value;
  value_local = (uint64_t)this;
  GetLocation(&local_48,this);
  Type::Type(&local_50,I64);
  local_24 = (Enum)SharedValidator::OnConst(&this->validator_,&local_48,local_50);
  bVar1 = Failed((Result)local_24);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,I64Const,local_20);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnI64ConstExpr(uint64_t value) {
  CHECK_RESULT(validator_.OnConst(GetLocation(), Type::I64));
  istream_.Emit(Opcode::I64Const, value);
  return Result::Ok;
}